

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclLibUtil.c
# Opt level: O2

void Abc_SclLinkCells(SC_Lib *p)

{
  Vec_Ptr_t *p_00;
  word *pwVar1;
  word *pwVar2;
  uint uVar3;
  long lVar4;
  int iVar5;
  SC_Cell *p_01;
  SC_Cell *p_02;
  Vec_Wrd_t *pVVar6;
  Vec_Wrd_t *pVVar7;
  SC_Cell *pSVar8;
  Vec_Ptr_t *p_03;
  void *pvVar9;
  void *pvVar10;
  void *pvVar11;
  ulong uVar12;
  ulong uVar13;
  int iVar14;
  long lVar15;
  int iVar16;
  bool bVar17;
  void **local_40;
  
  if ((p->vCellClasses).nSize != 0) {
    __assert_fail("Vec_PtrSize(&p->vCellClasses) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/scl/sclLibUtil.c"
                  ,0x10b,"void Abc_SclLinkCells(SC_Lib *)");
  }
  p_00 = &p->vCellClasses;
  p_02 = (SC_Cell *)0x0;
  iVar14 = 0;
  do {
    if ((p->vCells).nSize <= iVar14) {
      qsort((p->vCellClasses).pArray,(long)(p->vCellClasses).nSize,8,Abc_SclCompareCells);
      p_03 = (Vec_Ptr_t *)malloc(0x10);
      p_03->nCap = 100;
      local_40 = (void **)malloc(800);
      p_03->pArray = local_40;
      uVar12 = (ulong)(uint)(p->vCellClasses).nSize;
      lVar15 = 0;
      while( true ) {
        if ((int)uVar12 <= lVar15) {
          free(local_40);
          free(p_03);
          return;
        }
        pvVar9 = Vec_PtrEntry(p_00,(int)lVar15);
        p_03->nSize = 0;
        iVar14 = 0;
        for (pvVar10 = pvVar9;
            (bVar17 = iVar14 == 0, iVar14 = iVar14 + -1, bVar17 || (pvVar10 != pvVar9));
            pvVar10 = *(void **)((long)pvVar10 + 0x48)) {
          Vec_PtrPush(p_03,pvVar10);
        }
        local_40 = p_03->pArray;
        iVar14 = p_03->nSize;
        qsort(local_40,(long)iVar14,8,Abc_SclCompareCells);
        pvVar10 = Vec_PtrEntry(p_03,0);
        *(void **)((long)pvVar10 + 0x50) = pvVar10;
        *(void **)((long)pvVar10 + 0x48) = pvVar10;
        *(void **)((long)pvVar10 + 0x58) = pvVar10;
        pvVar9 = Vec_PtrEntry(p_03,iVar14 / 2);
        *(void **)((long)pvVar10 + 0x60) = pvVar9;
        *(undefined4 *)((long)pvVar10 + 0x68) = 0;
        *(int *)((long)pvVar10 + 0x6c) = iVar14;
        for (iVar16 = 1; iVar16 < iVar14; iVar16 = iVar16 + 1) {
          pvVar9 = Vec_PtrEntry(p_03,iVar16);
          lVar4 = *(long *)((long)pvVar10 + 0x50);
          *(void **)(lVar4 + 0x48) = pvVar9;
          *(void **)((long)pvVar9 + 0x48) = pvVar10;
          *(long *)((long)pvVar9 + 0x50) = lVar4;
          *(void **)((long)pvVar10 + 0x50) = pvVar9;
          *(void **)((long)pvVar9 + 0x58) = pvVar10;
          pvVar11 = Vec_PtrEntry(p_03,iVar14 / 2);
          *(void **)((long)pvVar9 + 0x60) = pvVar11;
          *(int *)((long)pvVar9 + 0x68) = iVar16;
          *(int *)((long)pvVar9 + 0x6c) = iVar14;
        }
        uVar12 = (ulong)(p->vCellClasses).nSize;
        if ((long)uVar12 <= lVar15) break;
        (p->vCellClasses).pArray[lVar15] = pvVar10;
        lVar15 = lVar15 + 1;
      }
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                    ,0x1a6,"void Vec_PtrWriteEntry(Vec_Ptr_t *, int, void *)");
    }
    p_01 = (SC_Cell *)Vec_PtrEntry(&p->vCells,iVar14);
    for (iVar16 = 0; iVar5 = (p->vCellClasses).nSize, iVar16 < iVar5; iVar16 = iVar16 + 1) {
      p_02 = (SC_Cell *)Vec_PtrEntry(p_00,iVar16);
      if ((p_01->n_inputs == p_02->n_inputs) && (p_01->n_outputs == p_02->n_outputs)) {
        pVVar6 = SC_CellFunc(p_01);
        pVVar7 = SC_CellFunc(p_02);
        uVar3 = pVVar6->nSize;
        if (uVar3 == pVVar7->nSize) {
          uVar12 = (ulong)uVar3;
          if ((int)uVar3 < 1) {
            uVar12 = 0;
          }
          uVar13 = 0;
          do {
            if (uVar12 == uVar13) {
              iVar5 = (p->vCellClasses).nSize;
              goto LAB_003b8599;
            }
            pwVar1 = pVVar6->pArray + uVar13;
            pwVar2 = pVVar7->pArray + uVar13;
            uVar13 = uVar13 + 1;
          } while (*pwVar1 == *pwVar2);
        }
      }
    }
LAB_003b8599:
    if (iVar16 == iVar5) {
      Vec_PtrPush(p_00,p_01);
      pSVar8 = p_01;
    }
    else {
      pSVar8 = p_02->pPrev;
      pSVar8->pNext = p_01;
      p_01->pPrev = pSVar8;
      pSVar8 = p_02;
    }
    pSVar8->pPrev = p_01;
    p_01->pNext = pSVar8;
    iVar14 = iVar14 + 1;
  } while( true );
}

Assistant:

void Abc_SclLinkCells( SC_Lib * p )
{
    Vec_Ptr_t * vList;
    SC_Cell * pCell, * pRepr = NULL;
    int i, k;
    assert( Vec_PtrSize(&p->vCellClasses) == 0 );
    SC_LibForEachCell( p, pCell, i )
    {
        // find gate with the same function
        SC_LibForEachCellClass( p, pRepr, k )
            if ( pCell->n_inputs  == pRepr->n_inputs && 
                 pCell->n_outputs == pRepr->n_outputs && 
                 Vec_WrdEqual(SC_CellFunc(pCell), SC_CellFunc(pRepr)) )
                break;
        if ( k == Vec_PtrSize(&p->vCellClasses) )
        {
            Vec_PtrPush( &p->vCellClasses, pCell );
            pCell->pNext = pCell->pPrev = pCell;
            continue;
        }
        // add it to the list before the cell
        pRepr->pPrev->pNext = pCell; pCell->pNext = pRepr;
        pCell->pPrev = pRepr->pPrev; pRepr->pPrev = pCell;
    }
    // sort cells by size then by name
    qsort( (void *)Vec_PtrArray(&p->vCellClasses), Vec_PtrSize(&p->vCellClasses), sizeof(void *), (int(*)(const void *,const void *))Abc_SclCompareCells );
    // sort cell lists
    vList = Vec_PtrAlloc( 100 );
    SC_LibForEachCellClass( p, pRepr, k )
    {
        Vec_PtrClear( vList );
        SC_RingForEachCell( pRepr, pCell, i )
            Vec_PtrPush( vList, pCell );
        qsort( (void *)Vec_PtrArray(vList), (size_t)Vec_PtrSize(vList), sizeof(void *), (int(*)(const void *,const void *))Abc_SclCompareCells );
        // create new representative
        pRepr = (SC_Cell *)Vec_PtrEntry( vList, 0 );
        pRepr->pNext = pRepr->pPrev = pRepr;
        pRepr->pRepr = pRepr;
        pRepr->pAve  = (SC_Cell *)Vec_PtrEntry( vList, Vec_PtrSize(vList)/2 );
        pRepr->Order = 0;
        pRepr->nGates = Vec_PtrSize(vList);
        // relink cells
        Vec_PtrForEachEntryStart( SC_Cell *, vList, pCell, i, 1 )
        {
            pRepr->pPrev->pNext = pCell; pCell->pNext = pRepr;
            pCell->pPrev = pRepr->pPrev; pRepr->pPrev = pCell;
            pCell->pRepr = pRepr;
            pCell->pAve  = (SC_Cell *)Vec_PtrEntry( vList, Vec_PtrSize(vList)/2 );
            pCell->Order = i;
            pCell->nGates = Vec_PtrSize(vList);
        }
        // update list
        Vec_PtrWriteEntry( &p->vCellClasses, k, pRepr );
    }
    Vec_PtrFree( vList );
}